

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_formats.c
# Opt level: O3

FMStructDescList get_localized_formats_dill(FMFormat f,dill_stream_conflict s)

{
  FMFormat_conflict p_Var1;
  FMFormat_conflict *pp_Var2;
  FMStructDescList subformats;
  long lVar3;
  uint uVar4;
  FMStructDescList subformats_00;
  ulong uVar5;
  
  pp_Var2 = f->subformats;
  if (pp_Var2 == (FMFormat_conflict *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0xffffffff;
    do {
      uVar4 = uVar4 + 1;
      p_Var1 = *pp_Var2;
      pp_Var2 = pp_Var2 + 1;
    } while (p_Var1 != (FMFormat_conflict)0x0);
  }
  uVar5 = (ulong)uVar4;
  subformats = (FMStructDescList)ffs_malloc(uVar5 * 0x20 + 0x40);
  subformats[uVar5 + 1].opt_info = (FMOptInfo *)0x0;
  subformats[uVar5 + 1].format_name = (char *)0x0;
  subformats[uVar5 + 1].field_list = (FMFieldList)0x0;
  subformats[uVar5 + 1].struct_size = 0;
  if (uVar4 != 0) {
    lVar3 = (long)(int)uVar4;
    subformats_00 = subformats + lVar3;
    do {
      lVar3 = lVar3 + -1;
      generate_localized_subformat(f->subformats[lVar3],subformats_00,s);
      subformats_00 = subformats_00 + -1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  generate_localized_subformat(f,subformats,s);
  return subformats;
}

Assistant:

extern FMStructDescList
get_localized_formats_dill(FMFormat f, dill_stream s)
{
    FMStructDescList ret_list;
    int subformat_count = 0;
    while(f->subformats && (f->subformats[subformat_count] != NULL)) {
	subformat_count++;
    }
    ret_list = malloc(sizeof(ret_list[0]) * (subformat_count+2));
    int i = 0;
    ret_list[subformat_count+1].format_name = NULL;
    ret_list[subformat_count+1].field_list = NULL;
    ret_list[subformat_count+1].struct_size = 0;
    ret_list[subformat_count+1].opt_info = 0;
    for (i=0; i < subformat_count; i++) {
	generate_localized_subformat(f->subformats[subformat_count-i-1], &ret_list[subformat_count - i], s);
    }
    generate_localized_subformat(f, ret_list, s);
    return ret_list;
}